

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event.cxx
# Opt level: O2

void __thiscall
trento::Event::compute_nuclear_thickness
          (Event *this,Nucleus *nucleus,NucleonCommon *nucleon_common,Grid *TX)

{
  undefined1 auVar1 [16];
  size_type sVar2;
  double *pdVar3;
  pointer pNVar4;
  long lVar5;
  undefined1 auVar6 [32];
  int iVar7;
  int iVar8;
  int iVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  NucleonData *nucleon;
  pointer nucleon_00;
  long lVar15;
  int ix;
  long lVar16;
  ulong uVar17;
  undefined1 auVar18 [32];
  double dVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  array<double,_4UL> boundary;
  array<double,_4UL> local_50;
  
  lVar14 = (TX->super_multi_array_ref<double,_2UL>).
           super_const_multi_array_ref<double,_2UL,_double_*>.origin_offset_;
  sVar2 = (TX->super_multi_array_ref<double,_2UL>).
          super_const_multi_array_ref<double,_2UL,_double_*>.num_elements_;
  pdVar3 = (TX->super_multi_array_ref<double,_2UL>).
           super_const_multi_array_ref<double,_2UL,_double_*>.base_;
  for (lVar13 = 0; sVar2 << 3 != lVar13; lVar13 = lVar13 + 8) {
    *(undefined8 *)((long)pdVar3 + lVar13 + lVar14 * 8) = 0;
  }
  pNVar4 = (nucleus->nucleons_).
           super__Vector_base<trento::NucleonData,_std::allocator<trento::NucleonData>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (nucleon_00 = (nucleus->nucleons_).
                    super__Vector_base<trento::NucleonData,_std::allocator<trento::NucleonData>_>.
                    _M_impl.super__Vector_impl_data._M_start; nucleon_00 != pNVar4;
      nucleon_00 = nucleon_00 + 1) {
    if (nucleon_00->is_participant_ == true) {
      this->npart_ = this->npart_ + 1;
      NucleonCommon::boundary(&local_50,nucleon_common,nucleon_00);
      dVar19 = this->xymax_;
      auVar18._8_8_ = dVar19;
      auVar18._0_8_ = dVar19;
      auVar18._16_8_ = dVar19;
      auVar18._24_8_ = dVar19;
      auVar18 = vaddpd_avx512vl((undefined1  [32])local_50._M_elems,auVar18);
      dVar19 = this->dxy_;
      auVar6._8_8_ = dVar19;
      auVar6._0_8_ = dVar19;
      auVar6._16_8_ = dVar19;
      auVar6._24_8_ = dVar19;
      auVar18 = vdivpd_avx512vl(auVar18,auVar6);
      iVar9 = this->nsteps_ + -1;
      auVar20._0_4_ = (int)auVar18._0_8_;
      auVar20._4_4_ = (int)auVar18._8_8_;
      auVar20._8_4_ = (int)auVar18._16_8_;
      auVar20._12_4_ = (int)auVar18._24_8_;
      uVar17 = vpmovd2m_avx512vl(auVar20);
      iVar7 = auVar20._0_4_;
      if (iVar9 < auVar20._0_4_) {
        iVar7 = iVar9;
      }
      iVar8 = auVar20._4_4_;
      if (iVar9 < auVar20._4_4_) {
        iVar8 = iVar9;
      }
      lVar13 = (long)iVar7;
      lVar14 = (long)iVar8;
      iVar7 = auVar20._8_4_;
      if (iVar9 < auVar20._8_4_) {
        iVar7 = iVar9;
      }
      lVar15 = (long)iVar7;
      if (auVar20._12_4_ <= iVar9) {
        iVar9 = auVar20._12_4_;
      }
      lVar10 = (long)iVar9;
      if ((uVar17 & 1) != 0) {
        lVar13 = 0;
      }
      if ((uVar17 & 2) != 0) {
        lVar14 = 0;
      }
      if ((uVar17 & 4) != 0) {
        lVar15 = 0;
      }
      if ((uVar17 & 8) != 0) {
        lVar10 = 0;
      }
      for (; lVar15 <= lVar10; lVar15 = lVar15 + 1) {
        for (lVar16 = lVar13; lVar16 <= lVar14; lVar16 = lVar16 + 1) {
          auVar22._8_8_ = 0;
          auVar22._0_8_ = this->dxy_;
          auVar23._8_8_ = 0;
          auVar23._0_8_ = this->xymax_;
          auVar21._8_8_ = 0;
          auVar21._0_8_ = (double)(int)lVar16 + 0.5;
          auVar21 = vfmsub213sd_fma(auVar21,auVar22,auVar23);
          auVar1._8_8_ = 0;
          auVar1._0_8_ = (double)(int)lVar15 + 0.5;
          auVar20 = vfmsub132sd_fma(auVar22,auVar23,auVar1);
          dVar19 = NucleonCommon::thickness(nucleon_common,nucleon_00,auVar21._0_8_,auVar20._0_8_);
          lVar5 = (TX->super_multi_array_ref<double,_2UL>).
                  super_const_multi_array_ref<double,_2UL,_double_*>.origin_offset_;
          pdVar3 = (TX->super_multi_array_ref<double,_2UL>).
                   super_const_multi_array_ref<double,_2UL,_double_*>.base_;
          lVar11 = (TX->super_multi_array_ref<double,_2UL>).
                   super_const_multi_array_ref<double,_2UL,_double_*>.stride_list_.elems[0] * lVar15
          ;
          lVar12 = (TX->super_multi_array_ref<double,_2UL>).
                   super_const_multi_array_ref<double,_2UL,_double_*>.stride_list_.elems[1] * lVar16
          ;
          pdVar3[lVar5 + lVar11 + lVar12] = dVar19 + pdVar3[lVar5 + lVar11 + lVar12];
        }
      }
    }
  }
  return;
}

Assistant:

void Event::compute_nuclear_thickness(
    const Nucleus& nucleus, const NucleonCommon& nucleon_common, Grid& TX) {
  // Construct the thickness grid by looping over participants and adding each
  // to a small subgrid within its radius.  Compared to the other possibility
  // (grid cells as the outer loop and participants as the inner loop), this
  // reduces the number of required distance-squared calculations by a factor of
  // ~20 (depending on the nucleon size).  The Event unit test verifies that the
  // two methods agree.

  // Wipe grid with zeros.
  std::fill(TX.origin(), TX.origin() + TX.num_elements(), 0.);

  // Deposit each participant onto the grid.
  for (const auto& nucleon : nucleus) {
    if (!nucleon.is_participant())
      continue;

    ++npart_;

    // Get nucleon subgrid boundary {xmin, xmax, ymin, ymax}.
    const auto boundary = nucleon_common.boundary(nucleon);

    // Determine min & max indices of nucleon subgrid.
    int ixmin = clip(static_cast<int>((boundary[0]+xymax_)/dxy_), 0, nsteps_-1);
    int ixmax = clip(static_cast<int>((boundary[1]+xymax_)/dxy_), 0, nsteps_-1);
    int iymin = clip(static_cast<int>((boundary[2]+xymax_)/dxy_), 0, nsteps_-1);
    int iymax = clip(static_cast<int>((boundary[3]+xymax_)/dxy_), 0, nsteps_-1);

    // Add profile to grid.
    for (auto iy = iymin; iy <= iymax; ++iy) {
      for (auto ix = ixmin; ix <= ixmax; ++ix) {
        TX[iy][ix] += nucleon_common.thickness(
          nucleon, (ix+.5)*dxy_ - xymax_, (iy+.5)*dxy_ - xymax_
        );
      }
    }
  }
}